

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-queue-foreach-delete.c
# Opt level: O0

void init_and_start_fs_events(uv_loop_t *loop)

{
  int iVar1;
  ulong uStack_18;
  int r;
  size_t i;
  uv_loop_t *loop_local;
  
  uStack_18 = 0;
  while( true ) {
    if (2 < uStack_18) {
      return;
    }
    iVar1 = uv_fs_event_init(loop,fs_event + uStack_18);
    if (iVar1 != 0) break;
    iVar1 = uv_fs_event_start(fs_event + uStack_18,fs_event_cbs[uStack_18],".",0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-queue-foreach-delete.c"
              ,0x94,"r == 0");
      abort();
    }
    uStack_18 = uStack_18 + 1;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-queue-foreach-delete.c"
          ,0x8e,"r == 0");
  abort();
}

Assistant:

static void init_and_start_fs_events(uv_loop_t* loop) {
  size_t i;
  for (i = 0; i < ARRAY_SIZE(fs_event); i++) {
    int r;
    r = uv_fs_event_init(loop, &fs_event[i]);
    ASSERT(r == 0);

    r = uv_fs_event_start(&fs_event[i],
                          (uv_fs_event_cb)fs_event_cbs[i],
                          watched_dir,
                          0);
    ASSERT(r == 0);
  }
}